

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O3

RefAST __thiscall
antlr::ASTFactory::make
          (ASTFactory *this,
          vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
          *nodes)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  ASTRef *pAVar3;
  long lVar4;
  ASTRefCount<antlr::AST> *other;
  long *in_RDX;
  ulong uVar5;
  AST *pAVar6;
  RefAST tail;
  ASTRefCount<antlr::AST> local_60;
  ASTFactory *local_58;
  ASTRefCount<antlr::AST> local_50;
  ASTRefCount<antlr::AST> local_48;
  ASTRefCount<antlr::AST> local_40;
  ASTRefCount<antlr::AST> local_38;
  
  local_58 = this;
  if ((long *)in_RDX[1] == (long *)*in_RDX) {
    this->_vptr_ASTFactory = (_func_int **)0x0;
  }
  else {
    pp_Var1 = *(_func_int ***)*in_RDX;
    if (pp_Var1 != (_func_int **)0x0) {
      *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
    }
    this->_vptr_ASTFactory = pp_Var1;
    local_60.ref = (ASTRef *)0x0;
    if ((pp_Var1 != (_func_int **)0x0) && (p_Var2 = *pp_Var1, p_Var2 != (_func_int *)0x0)) {
      local_60.ref = (ASTRef *)0x0;
      local_40.ref = (ASTRef *)0x0;
      (**(code **)(*(long *)p_Var2 + 0xa0))(p_Var2);
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_40);
    }
    lVar4 = *in_RDX;
    if (8 < (ulong)(in_RDX[1] - lVar4)) {
      uVar5 = 1;
      do {
        pAVar3 = *(ASTRef **)(lVar4 + uVar5 * 8);
        if ((pAVar3 != (ASTRef *)0x0) && (pAVar3->ptr != (AST *)0x0)) {
          if (((AST *)local_58->_vptr_ASTFactory == (AST *)0x0) ||
             (pp_Var1 = ((AST *)local_58->_vptr_ASTFactory)->_vptr_AST, pp_Var1 == (_func_int **)0x0
             )) {
            other = ASTRefCount<antlr::AST>::operator=
                              (&local_60,(ASTRefCount<antlr::AST> *)(lVar4 + uVar5 * 8));
            ASTRefCount<antlr::AST>::operator=((ASTRefCount<antlr::AST> *)local_58,other);
          }
          else {
            if ((local_60.ref == (ASTRef *)0x0) ||
               (pAVar6 = (local_60.ref)->ptr, pAVar6 == (AST *)0x0)) {
              pAVar3->count = pAVar3->count + 1;
              local_48.ref = pAVar3;
              (**(code **)(*pp_Var1 + 0xa0))(pp_Var1,&local_48);
              ASTRefCount<antlr::AST>::~ASTRefCount(&local_48);
              (**(code **)(*((AST *)local_58->_vptr_ASTFactory)->_vptr_AST + 0x68))(&local_38);
            }
            else {
              pAVar3->count = pAVar3->count + 1;
              local_50.ref = pAVar3;
              (*pAVar6->_vptr_AST[0x15])(pAVar6,&local_50);
              ASTRefCount<antlr::AST>::~ASTRefCount(&local_50);
              (*(local_60.ref)->ptr->_vptr_AST[0xe])(&local_38);
            }
            ASTRefCount<antlr::AST>::operator=(&local_60,&local_38);
            ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
          }
          if ((local_60.ref != (ASTRef *)0x0) &&
             (pAVar6 = (local_60.ref)->ptr, pAVar6 != (AST *)0x0)) {
            while ((*pAVar6->_vptr_AST[0xe])(&local_38), local_38.ref != (ASTRef *)0x0) {
              pAVar6 = (local_38.ref)->ptr;
              ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
              if (pAVar6 == (AST *)0x0) goto LAB_001667c6;
              (*(local_60.ref)->ptr->_vptr_AST[0xe])(&local_38);
              ASTRefCount<antlr::AST>::operator=(&local_60,&local_38);
              ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
              pAVar6 = (local_60.ref)->ptr;
            }
            ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
          }
        }
LAB_001667c6:
        uVar5 = (ulong)((int)uVar5 + 1);
        lVar4 = *in_RDX;
      } while (uVar5 < (ulong)(in_RDX[1] - lVar4 >> 3));
    }
    ASTRefCount<antlr::AST>::~ASTRefCount(&local_60);
  }
  return (RefAST)(ASTRef *)local_58;
}

Assistant:

RefAST ASTFactory::make(ANTLR_USE_NAMESPACE(std)vector<RefAST>& nodes)
{
	if ( nodes.size() == 0 )
		return RefAST(nullASTptr);

	RefAST root = nodes[0];
	RefAST tail = RefAST(nullASTptr);

	if( root )
		root->setFirstChild(RefAST(nullASTptr));	// don't leave any old pointers set

	// link in children;
	for( unsigned int i = 1; i < nodes.size(); i++ )
	{
		if ( nodes[i] == 0 )		// ignore null nodes
			continue;

		if ( root == 0 )			// Set the root and set it up for a flat list
			root = tail = nodes[i];
		else if ( tail == 0 )
		{
			root->setFirstChild(nodes[i]);
			tail = root->getFirstChild();
		}
		else
		{
			tail->setNextSibling(nodes[i]);
			tail = tail->getNextSibling();
		}

		if( tail )	// RK: I cannot fathom why this missing check didn't bite anyone else...
		{
			// Chase tail to last sibling
			while (tail->getNextSibling())
				tail = tail->getNextSibling();
		}
	}

	return root;
}